

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepcopy.cpp
# Opt level: O1

int __thiscall
ncnn::DeepCopy::forward(DeepCopy *this,Mat *bottom_blob,Mat *top_blob,Option *param_3)

{
  int *piVar1;
  int iVar2;
  void *in_R8;
  Mat local_58;
  
  Mat::clone(&local_58,(__fn *)bottom_blob,(void *)0x0,(int)param_3,in_R8);
  if (&local_58 != top_blob) {
    if (local_58.refcount != (int *)0x0) {
      LOCK();
      *local_58.refcount = *local_58.refcount + 1;
      UNLOCK();
    }
    piVar1 = top_blob->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (**(code **)(*(long *)top_blob->allocator + 0x18))();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    top_blob->data = local_58.data;
    top_blob->refcount = local_58.refcount;
    top_blob->elemsize = local_58.elemsize;
    top_blob->elempack = local_58.elempack;
    top_blob->allocator = local_58.allocator;
    top_blob->dims = local_58.dims;
    top_blob->w = local_58.w;
    top_blob->h = local_58.h;
    top_blob->d = local_58.d;
    top_blob->c = local_58.c;
    top_blob->cstep = local_58.cstep;
  }
  if (local_58.refcount != (int *)0x0) {
    LOCK();
    *local_58.refcount = *local_58.refcount + -1;
    UNLOCK();
    if (*local_58.refcount == 0) {
      if (local_58.allocator == (Allocator *)0x0) {
        if (local_58.data != (void *)0x0) {
          free(local_58.data);
        }
      }
      else {
        (**(code **)(*(long *)local_58.allocator + 0x18))();
      }
    }
  }
  if (top_blob->data == (void *)0x0) {
    iVar2 = -100;
  }
  else {
    iVar2 = -100;
    if ((long)top_blob->c * top_blob->cstep != 0) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int DeepCopy::forward(const Mat& bottom_blob, Mat& top_blob, const Option& /*opt*/) const
{
    top_blob = bottom_blob.clone();
    if (top_blob.empty())
        return -100;

    return 0;
}